

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPListener.h
# Opt level: O0

void __thiscall hwnet::TCPListener::~TCPListener(TCPListener *this)

{
  TCPListener *this_local;
  
  (this->super_Task)._vptr_Task = (_func_int **)&PTR_Do_00183ba0;
  (this->super_Channel)._vptr_Channel = (_func_int **)&DAT_00183bd8;
  std::function<void_(const_std::shared_ptr<hwnet::TCPListener>_&,_int)>::~function(&this->onError_)
  ;
  std::function<void_(const_std::shared_ptr<hwnet::TCPListener>_&,_int,_const_hwnet::Addr_&)>::
  ~function(&this->onNewConn_);
  std::enable_shared_from_this<hwnet::TCPListener>::~enable_shared_from_this
            (&this->super_enable_shared_from_this<hwnet::TCPListener>);
  Channel::~Channel(&this->super_Channel);
  Task::~Task(&this->super_Task);
  return;
}

Assistant:

~TCPListener(){}